

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O0

Option * __thiscall CLI::Option::expected(Option *this,int value)

{
  int value_local;
  Option *this_local;
  
  if (value < 0) {
    this->expected_min_ = -value;
    if (this->expected_max_ < this->expected_min_) {
      this->expected_max_ = this->expected_min_;
    }
    this->allow_extra_args_ = true;
    this->flag_like_ = false;
  }
  else if (value == 0x20000000) {
    this->expected_min_ = 1;
    this->expected_max_ = 0x20000000;
    this->allow_extra_args_ = true;
    this->flag_like_ = false;
  }
  else {
    this->expected_min_ = value;
    this->expected_max_ = value;
    this->flag_like_ = this->expected_min_ == 0;
  }
  return this;
}

Assistant:

CLI11_INLINE Option *Option::expected(int value) {
    if(value < 0) {
        expected_min_ = -value;
        if(expected_max_ < expected_min_) {
            expected_max_ = expected_min_;
        }
        allow_extra_args_ = true;
        flag_like_ = false;
    } else if(value == detail::expected_max_vector_size) {
        expected_min_ = 1;
        expected_max_ = detail::expected_max_vector_size;
        allow_extra_args_ = true;
        flag_like_ = false;
    } else {
        expected_min_ = value;
        expected_max_ = value;
        flag_like_ = (expected_min_ == 0);
    }
    return this;
}